

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O3

opj_pi_iterator_t *
opj_pi_initialise_encode
          (opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 p_tile_no,J2K_T2_MODE p_t2_mode)

{
  uint p_num_comps;
  opj_tcp_t *poVar1;
  opj_pi_resolution_t *poVar2;
  OPJ_UINT32 *pOVar3;
  undefined1 auVar4 [16];
  uint p_nb_elements;
  OPJ_UINT32 **ptr;
  OPJ_UINT32 **p_resolutions;
  opj_pi_iterator_t *p_pi;
  OPJ_INT16 *pOVar5;
  int iVar6;
  ulong uVar7;
  opj_pi_comp_t *poVar8;
  OPJ_UINT32 **ppOVar9;
  opj_pi_iterator_t *poVar10;
  OPJ_UINT32 OVar11;
  OPJ_UINT32 OVar12;
  opj_image_comp_t *poVar13;
  uint uVar14;
  OPJ_UINT32 OVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  OPJ_UINT32 l_dy_min;
  OPJ_UINT32 l_dx_min;
  OPJ_INT32 l_ty1;
  OPJ_INT32 l_ty0;
  OPJ_INT32 l_tx1;
  OPJ_INT32 l_tx0;
  opj_image_comp_t *local_58;
  ulong local_50;
  ulong local_48;
  opj_cp_t *local_40;
  OPJ_UINT32 l_max_prec;
  OPJ_UINT32 l_max_res;
  
  if (p_cp == (opj_cp_t *)0x0) {
    __assert_fail("p_cp != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x632,
                  "opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *, opj_cp_t *, OPJ_UINT32, J2K_T2_MODE)"
                 );
  }
  if (p_cp->th * p_cp->tw <= p_tile_no) {
    __assert_fail("p_tile_no < p_cp->tw * p_cp->th",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                  ,0x634,
                  "opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *, opj_cp_t *, OPJ_UINT32, J2K_T2_MODE)"
                 );
  }
  p_num_comps = p_image->numcomps;
  uVar17 = (ulong)p_num_comps;
  poVar1 = p_cp->tcps;
  local_50 = (ulong)poVar1[p_tile_no].numpocs;
  ptr = (OPJ_UINT32 **)opj_malloc((ulong)(p_num_comps * 0x84) << 2);
  if (ptr != (OPJ_UINT32 **)0x0) {
    p_resolutions = (OPJ_UINT32 **)opj_malloc(uVar17 * 8);
    if (p_resolutions != (OPJ_UINT32 **)0x0) {
      p_pi = opj_pi_create(p_image,p_cp,p_tile_no);
      auVar4 = _DAT_0013c070;
      if (p_pi != (opj_pi_iterator_t *)0x0) {
        if (uVar17 != 0) {
          lVar16 = uVar17 - 1;
          auVar19._8_4_ = (int)lVar16;
          auVar19._0_8_ = lVar16;
          auVar19._12_4_ = (int)((ulong)lVar16 >> 0x20);
          uVar7 = 0;
          auVar19 = auVar19 ^ _DAT_0013c070;
          ppOVar9 = ptr;
          auVar20 = _DAT_0013c060;
          do {
            auVar21._8_4_ = (int)ppOVar9;
            auVar21._0_8_ = ppOVar9;
            auVar21._12_4_ = (int)((ulong)ppOVar9 >> 0x20);
            auVar22 = auVar20 ^ auVar4;
            if ((bool)(~(auVar22._4_4_ == auVar19._4_4_ && auVar19._0_4_ < auVar22._0_4_ ||
                        auVar19._4_4_ < auVar22._4_4_) & 1)) {
              *(OPJ_UINT32 ***)((long)p_resolutions + uVar7) = ppOVar9;
            }
            if ((auVar22._12_4_ != auVar19._12_4_ || auVar22._8_4_ <= auVar19._8_4_) &&
                auVar22._12_4_ <= auVar19._12_4_) {
              *(long *)((long)p_resolutions + uVar7 + 8) = auVar21._8_8_ + 0x210;
            }
            lVar16 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 2;
            auVar20._8_8_ = lVar16 + 2;
            ppOVar9 = ppOVar9 + 0x84;
            uVar7 = uVar7 + 0x10;
          } while ((uVar17 * 8 + 8 & 0xfffffffffffffff0) != uVar7);
        }
        p_nb_elements = (int)local_50 + 1;
        opj_get_all_encoding_parameters
                  (p_image,p_cp,p_tile_no,&l_tx0,&l_tx1,&l_ty0,&l_ty1,&l_dx_min,&l_dy_min,
                   &l_max_prec,&l_max_res,p_resolutions);
        OVar12 = l_max_prec * p_num_comps;
        local_48 = (ulong)l_max_res;
        OVar11 = l_max_res * OVar12;
        p_pi->tp_on = *(byte *)((long)&p_cp->m_specific_param + 0x11) >> 3 & 1;
        uVar14 = poVar1[p_tile_no].numlayers * OVar11;
        p_pi->include_size = uVar14;
        local_40 = p_cp;
        pOVar5 = (OPJ_INT16 *)opj_calloc((ulong)uVar14,2);
        p_pi->include = pOVar5;
        if (pOVar5 == (OPJ_INT16 *)0x0) {
          opj_free(ptr);
          opj_free(p_resolutions);
          opj_pi_destroy(p_pi,p_nb_elements);
          return (opj_pi_iterator_t *)0x0;
        }
        poVar8 = p_pi->comps;
        local_58 = p_image->comps;
        p_pi->tx0 = l_tx0;
        p_pi->ty0 = l_ty0;
        p_pi->tx1 = l_tx1;
        p_pi->ty1 = l_ty1;
        p_pi->dx = l_dx_min;
        p_pi->dy = l_dy_min;
        p_pi->step_p = 1;
        p_pi->step_c = l_max_prec;
        p_pi->step_r = OVar12;
        p_pi->step_l = OVar11;
        if (p_num_comps != 0) {
          uVar7 = 0;
          poVar13 = local_58;
          do {
            poVar2 = poVar8->resolutions;
            pOVar3 = p_resolutions[uVar7];
            OVar15 = poVar13->dy;
            poVar8->dx = poVar13->dx;
            poVar8->dy = OVar15;
            OVar15 = poVar8->numresolutions;
            if (OVar15 != 0) {
              lVar16 = 0;
              do {
                *(undefined4 *)((long)&poVar2->pdx + lVar16) =
                     *(undefined4 *)((long)pOVar3 + lVar16);
                *(undefined4 *)((long)&poVar2->pdy + lVar16) =
                     *(undefined4 *)((long)pOVar3 + lVar16 + 4);
                *(undefined4 *)((long)&poVar2->pw + lVar16) =
                     *(undefined4 *)((long)pOVar3 + lVar16 + 8);
                *(undefined4 *)((long)&poVar2->ph + lVar16) =
                     *(undefined4 *)((long)pOVar3 + lVar16 + 0xc);
                lVar16 = lVar16 + 0x10;
                OVar15 = OVar15 - 1;
              } while (OVar15 != 0);
            }
            poVar8 = poVar8 + 1;
            poVar13 = poVar13 + 1;
            uVar7 = uVar7 + 1;
          } while (uVar7 != uVar17);
        }
        if (1 < p_nb_elements) {
          poVar10 = p_pi;
          iVar6 = 1;
          do {
            poVar8 = poVar10[1].comps;
            poVar10[1].tx0 = l_tx0;
            poVar10[1].ty0 = l_ty0;
            poVar10[1].tx1 = l_tx1;
            poVar10[1].ty1 = l_ty1;
            poVar10[1].dx = l_dx_min;
            poVar10[1].dy = l_dy_min;
            poVar10[1].step_p = 1;
            poVar10[1].step_c = l_max_prec;
            poVar10[1].step_r = OVar12;
            poVar10[1].step_l = OVar11;
            if (p_num_comps != 0) {
              uVar7 = 0;
              poVar13 = local_58;
              do {
                poVar2 = poVar8->resolutions;
                pOVar3 = p_resolutions[uVar7];
                OVar15 = poVar13->dy;
                poVar8->dx = poVar13->dx;
                poVar8->dy = OVar15;
                OVar15 = poVar8->numresolutions;
                if (OVar15 != 0) {
                  lVar16 = 0;
                  do {
                    *(undefined4 *)((long)&poVar2->pdx + lVar16) =
                         *(undefined4 *)((long)pOVar3 + lVar16);
                    *(undefined4 *)((long)&poVar2->pdy + lVar16) =
                         *(undefined4 *)((long)pOVar3 + lVar16 + 4);
                    *(undefined4 *)((long)&poVar2->pw + lVar16) =
                         *(undefined4 *)((long)pOVar3 + lVar16 + 8);
                    *(undefined4 *)((long)&poVar2->ph + lVar16) =
                         *(undefined4 *)((long)pOVar3 + lVar16 + 0xc);
                    lVar16 = lVar16 + 0x10;
                    OVar15 = OVar15 - 1;
                  } while (OVar15 != 0);
                }
                poVar8 = poVar8 + 1;
                poVar13 = poVar13 + 1;
                uVar7 = uVar7 + 1;
              } while (uVar7 != uVar17);
            }
            poVar10[1].include = poVar10->include;
            poVar10[1].include_size = poVar10->include_size;
            poVar10 = poVar10 + 1;
            bVar18 = iVar6 != (int)local_50;
            iVar6 = iVar6 + 1;
          } while (bVar18);
        }
        opj_free(ptr);
        OVar11 = 0x122ae3;
        opj_free(p_resolutions);
        if ((poVar1[p_tile_no].field_0x1638 & 4) != 0) {
          if (local_40->rsiz < 3) {
            if (p_t2_mode == FINAL_PASS) goto LAB_00122bb3;
          }
          else if (p_t2_mode == FINAL_PASS || local_40->rsiz < 7) {
LAB_00122bb3:
            opj_pi_update_encode_poc_and_final
                      (local_40,p_tile_no,l_tx0,l_tx1,l_ty0,l_ty1,l_max_prec,l_dx_min,l_dy_min,
                       OVar11);
            return p_pi;
          }
        }
        opj_pi_update_encode_not_poc
                  (local_40,p_num_comps,p_tile_no,l_tx0,l_tx1,l_ty0,l_ty1,l_max_prec,
                   (OPJ_UINT32)local_48,l_dx_min,l_dy_min);
        return p_pi;
      }
      opj_free(ptr);
      ptr = p_resolutions;
    }
    opj_free(ptr);
  }
  return (opj_pi_iterator_t *)0x0;
}

Assistant:

opj_pi_iterator_t *opj_pi_initialise_encode(const opj_image_t *p_image,
        opj_cp_t *p_cp,
        OPJ_UINT32 p_tile_no,
        J2K_T2_MODE p_t2_mode)
{
    OPJ_UINT32 numcomps = p_image->numcomps;

    /* loop*/
    OPJ_UINT32 pino;
    OPJ_UINT32 compno, resno;

    /* to store w, h, dx and dy fro all components and resolutions*/
    OPJ_UINT32 * l_tmp_data;
    OPJ_UINT32 ** l_tmp_ptr;

    /* encoding prameters to set*/
    OPJ_UINT32 l_max_res;
    OPJ_UINT32 l_max_prec;
    OPJ_INT32 l_tx0, l_tx1, l_ty0, l_ty1;
    OPJ_UINT32 l_dx_min, l_dy_min;
    OPJ_UINT32 l_bound;
    OPJ_UINT32 l_step_p, l_step_c, l_step_r, l_step_l ;
    OPJ_UINT32 l_data_stride;

    /* pointers*/
    opj_pi_iterator_t *l_pi = 00;
    opj_tcp_t *l_tcp = 00;
    const opj_tccp_t *l_tccp = 00;
    opj_pi_comp_t *l_current_comp = 00;
    opj_image_comp_t * l_img_comp = 00;
    opj_pi_iterator_t * l_current_pi = 00;
    OPJ_UINT32 * l_encoding_value_ptr = 00;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(p_tile_no < p_cp->tw * p_cp->th);

    /* initializations*/
    l_tcp = &p_cp->tcps[p_tile_no];
    l_bound = l_tcp->numpocs + 1;

    l_data_stride = 4 * OPJ_J2K_MAXRLVLS;
    l_tmp_data = (OPJ_UINT32*)opj_malloc(
                     l_data_stride * numcomps * sizeof(OPJ_UINT32));
    if (! l_tmp_data) {
        return 00;
    }

    l_tmp_ptr = (OPJ_UINT32**)opj_malloc(
                    numcomps * sizeof(OPJ_UINT32 *));
    if (! l_tmp_ptr) {
        opj_free(l_tmp_data);
        return 00;
    }

    /* memory allocation for pi*/
    l_pi = opj_pi_create(p_image, p_cp, p_tile_no);
    if (!l_pi) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        return 00;
    }

    l_encoding_value_ptr = l_tmp_data;
    /* update pointer array*/
    for (compno = 0; compno < numcomps; ++compno) {
        l_tmp_ptr[compno] = l_encoding_value_ptr;
        l_encoding_value_ptr += l_data_stride;
    }

    /* get encoding parameters*/
    opj_get_all_encoding_parameters(p_image, p_cp, p_tile_no, &l_tx0, &l_tx1,
                                    &l_ty0, &l_ty1, &l_dx_min, &l_dy_min, &l_max_prec, &l_max_res, l_tmp_ptr);

    /* step calculations*/
    l_step_p = 1;
    l_step_c = l_max_prec * l_step_p;
    l_step_r = numcomps * l_step_c;
    l_step_l = l_max_res * l_step_r;

    /* set values for first packet iterator*/
    l_pi->tp_on = (OPJ_BYTE)p_cp->m_specific_param.m_enc.m_tp_on;
    l_current_pi = l_pi;

    /* memory allocation for include*/
    l_current_pi->include_size = l_tcp->numlayers * l_step_l;
    l_current_pi->include = (OPJ_INT16*) opj_calloc(l_current_pi->include_size,
                            sizeof(OPJ_INT16));
    if (!l_current_pi->include) {
        opj_free(l_tmp_data);
        opj_free(l_tmp_ptr);
        opj_pi_destroy(l_pi, l_bound);
        return 00;
    }

    /* special treatment for the first packet iterator*/
    l_current_comp = l_current_pi->comps;
    l_img_comp = p_image->comps;
    l_tccp = l_tcp->tccps;
    l_current_pi->tx0 = l_tx0;
    l_current_pi->ty0 = l_ty0;
    l_current_pi->tx1 = l_tx1;
    l_current_pi->ty1 = l_ty1;
    l_current_pi->dx = l_dx_min;
    l_current_pi->dy = l_dy_min;
    l_current_pi->step_p = l_step_p;
    l_current_pi->step_c = l_step_c;
    l_current_pi->step_r = l_step_r;
    l_current_pi->step_l = l_step_l;

    /* allocation for components and number of components has already been calculated by opj_pi_create */
    for (compno = 0; compno < numcomps; ++compno) {
        opj_pi_resolution_t *l_res = l_current_comp->resolutions;
        l_encoding_value_ptr = l_tmp_ptr[compno];

        l_current_comp->dx = l_img_comp->dx;
        l_current_comp->dy = l_img_comp->dy;

        /* resolutions have already been initialized */
        for (resno = 0; resno < l_current_comp->numresolutions; resno++) {
            l_res->pdx = *(l_encoding_value_ptr++);
            l_res->pdy = *(l_encoding_value_ptr++);
            l_res->pw =  *(l_encoding_value_ptr++);
            l_res->ph =  *(l_encoding_value_ptr++);
            ++l_res;
        }

        ++l_current_comp;
        ++l_img_comp;
        ++l_tccp;
    }
    ++l_current_pi;

    for (pino = 1 ; pino < l_bound ; ++pino) {
        l_current_comp = l_current_pi->comps;
        l_img_comp = p_image->comps;
        l_tccp = l_tcp->tccps;

        l_current_pi->tx0 = l_tx0;
        l_current_pi->ty0 = l_ty0;
        l_current_pi->tx1 = l_tx1;
        l_current_pi->ty1 = l_ty1;
        l_current_pi->dx = l_dx_min;
        l_current_pi->dy = l_dy_min;
        l_current_pi->step_p = l_step_p;
        l_current_pi->step_c = l_step_c;
        l_current_pi->step_r = l_step_r;
        l_current_pi->step_l = l_step_l;

        /* allocation for components and number of components has already been calculated by opj_pi_create */
        for (compno = 0; compno < numcomps; ++compno) {
            opj_pi_resolution_t *l_res = l_current_comp->resolutions;
            l_encoding_value_ptr = l_tmp_ptr[compno];

            l_current_comp->dx = l_img_comp->dx;
            l_current_comp->dy = l_img_comp->dy;
            /* resolutions have already been initialized */
            for (resno = 0; resno < l_current_comp->numresolutions; resno++) {
                l_res->pdx = *(l_encoding_value_ptr++);
                l_res->pdy = *(l_encoding_value_ptr++);
                l_res->pw =  *(l_encoding_value_ptr++);
                l_res->ph =  *(l_encoding_value_ptr++);
                ++l_res;
            }
            ++l_current_comp;
            ++l_img_comp;
            ++l_tccp;
        }

        /* special treatment*/
        l_current_pi->include = (l_current_pi - 1)->include;
        l_current_pi->include_size = (l_current_pi - 1)->include_size;
        ++l_current_pi;
    }

    opj_free(l_tmp_data);
    l_tmp_data = 00;
    opj_free(l_tmp_ptr);
    l_tmp_ptr = 00;

    if (l_tcp->POC && (OPJ_IS_CINEMA(p_cp->rsiz) || p_t2_mode == FINAL_PASS)) {
        opj_pi_update_encode_poc_and_final(p_cp, p_tile_no, l_tx0, l_tx1, l_ty0, l_ty1,
                                           l_max_prec, l_max_res, l_dx_min, l_dy_min);
    } else {
        opj_pi_update_encode_not_poc(p_cp, numcomps, p_tile_no, l_tx0, l_tx1,
                                     l_ty0, l_ty1, l_max_prec, l_max_res, l_dx_min, l_dy_min);
    }

    return l_pi;
}